

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafuzz.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  undefined8 extraout_RAX;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 in_R9;
  int iVar12;
  int cnum;
  int32_t b;
  int32_t a;
  char *pcVar13;
  int *piVar14;
  char *pcVar15;
  int local_3c;
  uint local_38;
  int local_34;
  
  iVar1 = nva_init();
  if (iVar1 != 0) {
    main_cold_1();
    return 1;
  }
  piVar14 = &local_3c;
  local_3c = 0;
  while (uVar11 = (ulong)(uint)argc, iVar1 = getopt(argc,argv,"hc:"), iVar1 == 99) {
    __isoc99_sscanf(_optarg,"%d",piVar14);
  }
  if (iVar1 == -1) {
    if (nva_cardsnum <= local_3c) {
      if (nva_cardsnum == 0) {
        main_cold_4();
        return 1;
      }
      main_cold_3();
      return 1;
    }
    local_38 = 4;
    if (argc <= _optind) {
      fwrite("No address specified.\n",0x16,1,_stderr);
      return 1;
    }
    __isoc99_sscanf(argv[_optind],"%x",&local_34);
    if (_optind + 1 < argc) {
      __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_38);
    }
    tVar3 = time((time_t *)0x0);
    srand((int)tVar3 + *(int *)((long)nva_cards[local_3c]->bar0 + 0x9400));
    do {
      iVar1 = local_34;
      iVar12 = -0x18;
      uVar8 = 0;
      do {
        uVar2 = rand();
        uVar8 = (uVar2 & 1) + uVar8 * 2;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
      uVar8 = uVar8 % local_38;
      iVar12 = 0;
      iVar9 = -0x20;
      do {
        uVar2 = rand();
        iVar12 = (uVar2 & 1) + iVar12 * 2;
        iVar9 = iVar9 + 1;
      } while (iVar9 != 0);
      *(int *)((long)nva_cards[local_3c]->bar0 + (ulong)(uVar8 + iVar1 & 0xfffffc)) = iVar12;
    } while( true );
  }
  if (iVar1 == 0x68) {
    main_cold_2();
  }
  main_cold_5();
  pcVar15 = "hc:";
  pcVar13 = "%d";
  uVar5 = extraout_RAX;
  pvVar4 = calloc(0x90,1);
  if (pvVar4 != (void *)0x0) {
    *(ulong *)((long)pvVar4 + 8) = uVar11;
    iVar1 = pci_device_map_range
                      (uVar11,*(undefined8 *)(uVar11 + 0x28),*(undefined8 *)(uVar11 + 0x30),1,
                       (long)pvVar4 + 0x30,in_R9,uVar5,argv,pcVar13,piVar14,pcVar15);
    if (iVar1 == 0) {
      *(undefined8 *)((long)pvVar4 + 0x38) = *(undefined8 *)(uVar11 + 0x30);
      lVar7 = *(long *)(uVar11 + 0x58);
      if (lVar7 != 0) {
        *(undefined4 *)((long)pvVar4 + 0x40) = 1;
        *(long *)((long)pvVar4 + 0x50) = lVar7;
        iVar1 = pci_device_map_range
                          (uVar11,*(undefined8 *)(uVar11 + 0x50),lVar7,1,
                           (undefined8 *)((long)pvVar4 + 0x48),in_R9,uVar5,argv,pcVar13,piVar14,
                           pcVar15);
        if (iVar1 != 0) {
          *(undefined8 *)((long)pvVar4 + 0x48) = 0;
        }
      }
      lVar7 = *(long *)(uVar11 + 0x80);
      if ((lVar7 == 0) || ((*(byte *)(uVar11 + 0x88) & 1) != 0)) {
        lVar7 = *(long *)(uVar11 + 0xa8);
        if (lVar7 != 0) {
          *(undefined4 *)((long)pvVar4 + 0x58) = 1;
          *(long *)((long)pvVar4 + 0x68) = lVar7;
          uVar10 = *(undefined8 *)(uVar11 + 0xa0);
          goto LAB_00102827;
        }
      }
      else {
        *(undefined4 *)((long)pvVar4 + 0x58) = 1;
        *(long *)((long)pvVar4 + 0x68) = lVar7;
        uVar10 = *(undefined8 *)(uVar11 + 0x78);
LAB_00102827:
        iVar1 = pci_device_map_range
                          (uVar11,uVar10,lVar7,1,(undefined8 *)((long)pvVar4 + 0x60),in_R9,uVar5,
                           argv,pcVar13,piVar14,pcVar15);
        if (iVar1 != 0) {
          *(undefined8 *)((long)pvVar4 + 0x60) = 0;
        }
      }
      pci_device_map_legacy(uVar11,0,0x100000,1,(long)pvVar4 + 0x80);
      uVar5 = pci_legacy_open_io(uVar11,0,0x10000);
      *(undefined8 *)((long)pvVar4 + 0x88) = uVar5;
      if (*(long *)(uVar11 + 0x80) == 0) {
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = -(uint)((*(byte *)(uVar11 + 0x88) & 1) == 0) | 2;
      }
      if (((*(long *)(uVar11 + 0xf8) != 0) && (uVar2 = 5, (*(byte *)(uVar11 + 0x100) & 1) != 0)) ||
         (uVar2 = uVar8, uVar8 != 0xffffffff)) {
        uVar6 = (ulong)uVar2;
        uVar5 = pci_device_open_io(uVar11,*(undefined8 *)(uVar11 + 0x28 + uVar6 * 0x28),
                                   *(undefined8 *)(uVar11 + 0x30 + uVar6 * 0x28));
        *(undefined8 *)((long)pvVar4 + 0x70) = uVar5;
        *(undefined8 *)((long)pvVar4 + 0x78) = *(undefined8 *)(uVar11 + 0x30 + uVar6 * 0x28);
      }
      parse_pmc_id(**(uint32_t **)((long)pvVar4 + 0x30),(chipset_info *)((long)pvVar4 + 0x10));
      goto LAB_0010290a;
    }
    nva_init_gpu_cold_1();
  }
  pvVar4 = (void *)0x0;
LAB_0010290a:
  return (int)pvVar4;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "hc:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'h':
				usage(0);
			default:
				usage(1);
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	srand(time(0) + nva_rd32(cnum, 0x9400));
	while (1) {
		uint32_t reg = (a + proper_rand(24) % b) & 0xfffffc;
		uint32_t val = proper_rand(32);
		nva_wr32(cnum, reg, val);
	}
	return 0;
}